

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::iterate
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  void *pvVar4;
  ulong uVar5;
  pointer pTVar6;
  TestError *this_00;
  pointer pTVar7;
  char *description;
  uint uVar8;
  uint uVar9;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar10;
  long lVar11;
  TestContext *this_01;
  ulong uVar12;
  uchar buffer [256];
  uchar expectedData [4];
  ostringstream local_1a8 [376];
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x138);
    ppuVar10 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x78))(0x8ca9);
    uVar8 = 0;
    memset(buffer,0,0x100);
    while( true ) {
      uVar5 = (ulong)uVar8;
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)(this->m_textures_info).
                     super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7;
      uVar12 = lVar11 >> 4;
      if (uVar12 <= uVar5) break;
      (**(code **)(lVar3 + 0xb8))(pTVar7[uVar5].m_texture_target,pTVar7[uVar5].m_id);
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar3 + 0x1398))
                (pTVar7[uVar5].m_texture_target,1,0x8058,4,4,pTVar7[uVar5].m_depth);
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      (**(code **)(lVar3 + 0x13c0))
                (pTVar7[uVar5].m_texture_target,0,0,0,0,4,4,pTVar7[uVar5].m_depth,0x1908,0x1401,
                 buffer);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Error configuring a texture object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x14f);
      uVar8 = uVar8 + 1;
    }
    pvVar4 = operator_new__(lVar11 >> 2);
    for (uVar8 = 0; uVar5 = (ulong)uVar8, uVar5 < uVar12; uVar8 = uVar8 + 1) {
      *(GLenum *)((long)pvVar4 + uVar5 * 4) = pTVar7[uVar5].m_draw_buffer;
    }
    (**(code **)(lVar3 + 0x560))(uVar12 & 0xffffffff,pvVar4);
    operator_delete__(pvVar4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error setting draw buffers!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                    ,0x161);
    uVar8 = 0;
    while( true ) {
      uVar12 = (ulong)uVar8;
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->m_textures_info).
                        super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 4) <= uVar12)
      break;
      if (this->m_is_fbo_layered == true) {
        (**(code **)(lVar3 + 0x690))(0x8ca9,pTVar7[uVar12].m_draw_buffer,pTVar7[uVar12].m_id,0);
      }
      else {
        (**(code **)(lVar3 + 0x6b8))
                  (0x8ca9,pTVar7[uVar12].m_draw_buffer,pTVar7[uVar12].m_id,0,uVar12);
      }
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Error configuring framebuffer objects!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x171);
      uVar8 = uVar8 + 1;
    }
    iVar1 = (**(code **)(lVar3 + 0x170))(0x8ca9);
    if (iVar1 == 0x8cd5) {
      uVar9 = 0;
      (**(code **)(lVar3 + 0x1a00))(0,0,4);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Error setting up viewport!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x182);
      (**(code **)(lVar3 + 0xd8))(this->m_vao_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Error configuring vertex array object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x187);
      (**(code **)(lVar3 + 0x1680))(this->m_po_id);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Error using program object!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,0x18c);
      (**(code **)(lVar3 + 0x538))(this->m_draw_mode,0,this->m_n_points);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"Rendering failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                      ,400);
      (**(code **)(lVar3 + 0x78))(0x8ca8);
      pTVar7 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar6 = (this->m_textures_info).
               super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = 0;
      if ((long)pTVar6 - (long)pTVar7 != 0) {
        uVar8 = pTVar7->m_depth;
        for (uVar12 = 1; uVar12 < (ulong)((long)pTVar6 - (long)pTVar7 >> 4);
            uVar12 = (ulong)((int)uVar12 + 1)) {
          if ((uint)pTVar7[uVar12].m_depth <= uVar8) {
            uVar8 = pTVar7[uVar12].m_depth;
          }
        }
      }
      do {
        uVar12 = (ulong)uVar9;
        if ((ulong)((long)pTVar6 - (long)pTVar7 >> 4) <= uVar12) {
          this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
          description = "Pass";
          testResult = QP_TEST_RESULT_PASS;
LAB_00ce70cf:
          tcu::TestContext::setTestResult(this_01,testResult,description);
          return STOP;
        }
        for (uVar5 = 0; uVar8 != (uint)uVar5; uVar5 = (ulong)((uint)uVar5 + 1)) {
          (**(code **)(lVar3 + 0x6b8))
                    (0x8ca8,0x8ce0,
                     (this->m_textures_info).
                     super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].m_id,0,uVar5);
          dVar2 = (**(code **)(lVar3 + 0x800))();
          glu::checkError(dVar2,"Could not set up read framebuffer!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                          ,0x1ad);
          iVar1 = (**(code **)(lVar3 + 0x170))(0x8ca9);
          if (iVar1 != 0x8cd5) {
            _expectedData =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(local_1a8);
            std::operator<<((ostream *)local_1a8,"Read FBO is incomplete: ");
            std::operator<<((ostream *)local_1a8,"[");
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::operator<<((ostream *)local_1a8,"]");
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)expectedData,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(local_1a8);
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Read FBO is incomplete.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                       ,0x1b7);
            goto LAB_00ce7198;
          }
          (**(code **)(lVar3 + 0x1a00))(0,0,4,4);
          (**(code **)(lVar3 + 0x1220))(0,0,4,4,0x1908,0x1401,buffer);
          dVar2 = (**(code **)(lVar3 + 0x800))();
          glu::checkError(dVar2,"Could not read pixels using glReadPixels()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
                          ,0x1bf);
          (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])
                    (this,uVar5,expectedData,4);
          iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
                            (this,4,4,4,buffer,expectedData,uVar12,uVar5);
          if ((char)iVar1 == '\0') {
            this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
            description = "Fail";
            testResult = QP_TEST_RESULT_FAIL;
            goto LAB_00ce70cf;
          }
        }
        uVar9 = uVar9 + 1;
        pTVar7 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pTVar6 = (this->m_textures_info).
                 super__Vector_base<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo,_std::allocator<glcts::GeometryShaderLayeredRenderingBoundaryCondition::TextureInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    _expectedData = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,"Draw FBO is incomplete: ");
    std::operator<<((ostream *)local_1a8,"[");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::operator<<((ostream *)local_1a8,"]");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)expectedData,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Draw FBO is incomplete.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp"
               ,0x17c);
LAB_00ce7198:
    ppuVar10 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(this_00,ppuVar10,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRenderingBoundaryCondition::iterate(void)
{
	/* check if EXT_geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);

	/* Set up all textures */
	unsigned char buffer[m_width * m_height * m_max_depth * m_texture_components];

	memset(buffer, 0, sizeof(buffer));

	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		gl.bindTexture(m_textures_info[i].m_texture_target, m_textures_info[i].m_id);
		gl.texStorage3D(m_textures_info[i].m_texture_target, 1, GL_RGBA8, m_width, m_height,
						m_textures_info[i].m_depth);
		gl.texSubImage3D(m_textures_info[i].m_texture_target, 0, 0, 0, 0, m_width, m_height, m_textures_info[i].m_depth,
						 GL_RGBA, GL_UNSIGNED_BYTE, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring a texture object!");
	}

	/* Set up draw buffers */
	{
		glw::GLenum* drawBuffers = new glw::GLenum[m_textures_info.size()];

		for (unsigned int i = 0; i < m_textures_info.size(); i++)
		{
			drawBuffers[i] = m_textures_info[i].m_draw_buffer;
		}

		gl.drawBuffers((glw::GLsizei)m_textures_info.size(), drawBuffers);

		delete[] drawBuffers;
		drawBuffers = 0;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting draw buffers!");

	/* Configure draw FBO so that it uses texture attachments */
	for (unsigned int i = 0; i < m_textures_info.size(); i++)
	{
		if (m_is_fbo_layered)
		{
			gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
								  0 /* level */);
		}
		else
		{
			gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, m_textures_info[i].m_draw_buffer, m_textures_info[i].m_id,
									   0 /* level */, i /* layer */);
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring framebuffer objects!");
	} /* for (all textures considered) */

	/* Verify draw framebuffer is considered complete */
	glw::GLenum fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

	if (fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Draw FBO is incomplete: "
						   << "[" << fboCompleteness << "]" << tcu::TestLog::EndMessage;

		TCU_FAIL("Draw FBO is incomplete.");
	}

	/* Set up viewport */
	gl.viewport(0, 0, m_width, m_height);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up viewport!");

	/** Bind a vertex array object */
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error configuring vertex array object!");

	/* Render */
	gl.useProgram(m_po_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program object!");

	gl.drawArrays(m_draw_mode, 0, m_n_points);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

	/* Bind read framebuffer object. */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);

	/* Compare the rendered data against reference representation */
	unsigned int min_depth = 0;

	if (m_textures_info.size() > 0)
	{
		min_depth = m_textures_info[0].m_depth;

		for (unsigned int nTexture = 1; nTexture < m_textures_info.size(); nTexture++)
		{
			if (min_depth > (unsigned)m_textures_info[nTexture].m_depth)
			{
				min_depth = m_textures_info[nTexture].m_depth;
			}
		}
	}

	for (unsigned int nTexture = 0; nTexture < m_textures_info.size(); nTexture++)
	{
		for (unsigned int nLayer = 0; nLayer < min_depth; nLayer++)
		{
			/* Configure read FBO's color attachment */
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_textures_info[nTexture].m_id, 0,
									   nLayer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up read framebuffer!");

			/* Verify read framebuffer is considered complete */
			glw::GLenum _fboCompleteness = gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

			if (_fboCompleteness != GL_FRAMEBUFFER_COMPLETE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Read FBO is incomplete: "
								   << "[" << _fboCompleteness << "]" << tcu::TestLog::EndMessage;

				TCU_FAIL("Read FBO is incomplete.");
			}
			gl.viewport(0, 0, m_width, m_height);

			/* Read the rendered data */
			gl.readPixels(0 /* x */, 0 /* y */, m_width /* width */, m_height /* height */, GL_RGBA, GL_UNSIGNED_BYTE,
						  buffer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not read pixels using glReadPixels()");

			/* Retrieve reference color for layer */
			unsigned char expectedData[m_texture_components];

			getReferenceColor(nLayer, expectedData, m_texture_components);

			/* Compare the retrieved data with reference data */
			if (!comparePixels(m_width, m_height, m_texture_components, buffer, expectedData, nTexture, nLayer))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			} /* if (data comparison failed) */
		}	 /* for (all layers) */
	}		  /* for (all texture objects) */

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}